

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::Extend(ON_LineCurve *this,ON_Interval *domain)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_Line local_150;
  ON_Interval local_120;
  ON_3dVector local_110;
  ON_Interval local_f8;
  ON_Interval local_e8;
  ON_3dVector local_d8;
  ON_Interval local_c0;
  byte local_a9;
  undefined1 auStack_a8 [7];
  bool do_it;
  double local_98;
  double t1;
  double local_80;
  double t0;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dVector V;
  double len;
  ON_Interval *domain_local;
  ON_LineCurve *this_local;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  dVar2 = ON_Interval::Length((ON_Interval *)&V.z);
  ON_Line::Direction((ON_3dVector *)&Q0.z,&this->m_line);
  Q1.z = (this->m_line).from.x;
  Q0.x = (this->m_line).from.y;
  Q0.y = (this->m_line).from.z;
  t0 = (this->m_line).to.x;
  Q1.x = (this->m_line).to.y;
  Q1.y = (this->m_line).to.z;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&t1,0);
  local_80 = *pdVar1;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar1 = ON_Interval::operator[]((ON_Interval *)auStack_a8,1);
  local_98 = *pdVar1;
  local_a9 = 0;
  dVar3 = ON_Interval::operator[](domain,1);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar1 = ON_Interval::operator[](&local_c0,1);
  if (*pdVar1 <= dVar3 && dVar3 != *pdVar1) {
    dVar3 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    pdVar1 = ON_Interval::operator[](&local_e8,1);
    ::operator*(&local_d8,(dVar3 - *pdVar1) / dVar2,(ON_3dVector *)&Q0.z);
    ON_3dPoint::operator+=((ON_3dPoint *)&t0,&local_d8);
    local_98 = ON_Interval::operator[](domain,1);
    local_a9 = 1;
  }
  dVar3 = ON_Interval::operator[](domain,0);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar1 = ON_Interval::operator[](&local_f8,0);
  if (dVar3 < *pdVar1) {
    dVar4 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    local_120.m_t[1] = dVar3;
    pdVar1 = ON_Interval::operator[](&local_120,0);
    ::operator*(&local_110,(dVar4 - *pdVar1) / dVar2,(ON_3dVector *)&Q0.z);
    ON_3dPoint::operator+=((ON_3dPoint *)&Q1.z,&local_110);
    local_80 = ON_Interval::operator[](domain,0);
    local_a9 = 1;
  }
  if ((local_a9 & 1) != 0) {
    from_pt.y = Q0.x;
    from_pt.x = Q1.z;
    from_pt.z = Q0.y;
    to_pt.y = Q1.x;
    to_pt.x = t0;
    to_pt.z = Q1.y;
    ON_Line::ON_Line(&local_150,from_pt,to_pt);
    memcpy(&this->m_line,&local_150,0x30);
    ON_Line::~ON_Line(&local_150);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (local_80,local_98);
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  }
  return (bool)(local_a9 & 1);
}

Assistant:

bool ON_LineCurve::Extend(
  const ON_Interval& domain
  )

{
  double len = Domain().Length();
  ON_3dVector V = m_line.Direction();
  ON_3dPoint Q0 = m_line.from;
  ON_3dPoint Q1 = m_line.to;
  double t0 = Domain()[0];
  double t1 = Domain()[1];
  bool do_it = false;
  if (domain[1] > Domain()[1]) {
    Q1 += (domain[1]-Domain()[1])/len*V;
    t1 = domain[1];
    do_it = true;
  }
  if (domain[0] < Domain()[0]) {
    Q0 += (domain[0]-Domain()[0])/len*V;
    t0 = domain[0];
    do_it = true;
  }

  if (do_it){
    m_line = ON_Line(Q0, Q1);
    SetDomain(t0, t1);
    DestroyCurveTree();
  }
  return do_it;
}